

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

void __thiscall pktalloc::Allocator::Allocator(Allocator *this)

{
  WindowHeader *this_00;
  WindowHeader *window;
  uint i;
  long lVar1;
  
  this->HugeChunkStart = (uint8_t *)0x0;
  (this->PreferredWindows).Size = 0;
  (this->PreferredWindows).Allocated = 0x19;
  (this->PreferredWindows).DataPtr = (this->PreferredWindows).PreallocatedData;
  (this->FullWindows).Size = 0;
  (this->FullWindows).Allocated = 0x19;
  (this->FullWindows).DataPtr = (this->FullWindows).PreallocatedData;
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_NoCopy(&this->PreferredWindows,2);
  this_00 = (WindowHeader *)SIMDSafeAllocate(0x20240);
  this->HugeChunkStart = (uint8_t *)this_00;
  if (this_00 != (WindowHeader *)0x0) {
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      CustomBitSet<2048U>::ClearAll(&this_00->Used);
      this_00->FreeUnitCount = 0x800;
      this_00->ResumeScanOffset = 0;
      this_00->Preallocated = true;
      this_00->FullListIndex = -1;
      (this->PreferredWindows).DataPtr[lVar1] = this_00;
      this_00 = this_00 + 0xf2;
    }
  }
  return;
}

Assistant:

Allocator::Allocator()
{
    static_assert(kAlignmentBytes == kUnitSize, "update SIMDSafeAllocate");

    PreferredWindows.SetSize_NoCopy(kPreallocatedWindows);

    HugeChunkStart = SIMDSafeAllocate(kWindowSizeBytes * kPreallocatedWindows);
    if (HugeChunkStart)
    {
        uint8_t* windowStart = HugeChunkStart;

        // For each window to preallocate:
        for (unsigned i = 0; i < kPreallocatedWindows; ++i)
        {
            WindowHeader* window = (WindowHeader*)windowStart;
            windowStart += kWindowSizeBytes;

            window->Used.ClearAll();
            window->FreeUnitCount = kWindowMaxUnits;
            window->ResumeScanOffset = 0;
            window->Preallocated = true;
            window->FullListIndex = kNotInFullList;

            PreferredWindows.GetRef(i) = window;
        }
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();
}